

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_SpawnShot2(FParser *this)

{
  svalue_t *psVar1;
  double dVar2;
  bool bVar3;
  AActor *pAVar4;
  PClassActor *type;
  AActor *ent;
  AActor *pAVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  FSoundID local_54;
  svalue_t local_50;
  DVector3 local_38;
  
  if (1 < this->t_argc) {
    psVar1 = this->t_argv;
    if ((psVar1[1].type == 1) && (psVar1[1].value.i < 0)) {
      pAVar4 = (this->Script->trigger).field_0.p;
      if ((pAVar4 != (AActor *)0x0) &&
         (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (this->Script->trigger).field_0.p = (AActor *)0x0;
        pAVar4 = (AActor *)0x0;
      }
    }
    else {
      pAVar4 = actorvalue(psVar1 + 1);
    }
    uVar6 = 0;
    uVar7 = 0;
    if (2 < this->t_argc) {
      dVar2 = floatvalue(this->t_argv + 2);
      uVar6 = SUB84(dVar2,0);
      uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    if (pAVar4 != (AActor *)0x0) {
      svalue_t::svalue_t(&local_50,this->t_argv);
      type = T_GetMobjType(&local_50);
      FString::~FString(&local_50.string);
      if (type != (PClassActor *)0x0) {
        (this->t_return).type = 2;
        local_38.Z = (double)CONCAT44(uVar7,uVar6) + (pAVar4->__Pos).Z;
        local_38.X = (pAVar4->__Pos).X;
        local_38.Y = (pAVar4->__Pos).Y;
        ent = AActor::StaticSpawn(type,&local_38,ALLOW_REPLACE,false);
        pAVar5 = (AActor *)0x0;
        if (ent != (AActor *)0x0) {
          local_54.ID = (ent->SeeSound).super_FSoundID.ID;
          S_Sound(ent,2,&local_54,1.0,1.0);
          (ent->target).field_0.p = pAVar4;
          (ent->Angles).Yaw.Degrees = (pAVar4->Angles).Yaw.Degrees;
          AActor::Thrust(ent);
          bVar3 = P_CheckMissileSpawn(ent,pAVar4->radius);
          pAVar5 = (AActor *)0x0;
          if (bVar3) {
            pAVar5 = ent;
          }
        }
        (this->t_return).value.mobj = pAVar5;
      }
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_SpawnShot2(void)
{
	AActor *source = NULL;
	PClassActor * pclass;
	double z = 0;

	// t_argv[0] = type to spawn
	// t_argv[1] = source mobj, optional, -1 to default
	// shoots at source's angle

	if (CheckArgs(2))
	{
		if (t_argv[1].type == svt_int && t_argv[1].value.i < 0)
			source = Script->trigger;
		else
			source = actorvalue(t_argv[1]);

		if (t_argc > 2) z = floatvalue(t_argv[2]);

		if (!source)	return;

		if (!(pclass = T_GetMobjType(t_argv[0]))) return;

		t_return.type = svt_mobj;

		AActor *mo = Spawn(pclass, source->PosPlusZ(z), ALLOW_REPLACE);
		if (mo)
		{
			S_Sound(mo, CHAN_VOICE, mo->SeeSound, 1, ATTN_NORM);
			mo->target = source;
			mo->Angles.Yaw = source->Angles.Yaw;
			mo->Thrust();
			if (!P_CheckMissileSpawn(mo, source->radius)) mo = NULL;
		}
		t_return.value.mobj = mo;
	}
}